

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.h
# Opt level: O2

pair<std::shared_ptr<vmips::CFGNode>,_std::shared_ptr<vmips::CFGNode>_> * __thiscall
vmips::Function::
branch<vmips::beq,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&>
          (pair<std::shared_ptr<vmips::CFGNode>,_std::shared_ptr<vmips::CFGNode>_>
           *__return_storage_ptr__,Function *this,shared_ptr<vmips::VirtReg> *args,
          shared_ptr<vmips::VirtReg> *args_1)

{
  CFGNode *this_00;
  string b;
  string a;
  string sStack_a8;
  string local_88;
  string local_68 [32];
  string local_48 [32];
  
  vmips::Function::next_name_abi_cxx11_();
  vmips::Function::next_name_abi_cxx11_();
  this_00 = *(CFGNode **)(this + 0x148);
  std::__cxx11::string::string((string *)&local_88,local_48);
  std::__cxx11::string::string((string *)&sStack_a8,local_68);
  CFGNode::branch<vmips::beq,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&>
            (__return_storage_ptr__,this_00,&local_88,&sStack_a8,args,args_1);
  std::__cxx11::string::~string((string *)&sStack_a8);
  std::__cxx11::string::~string((string *)&local_88);
  if (*(CFGNode **)(this + 0x148) != *(CFGNode **)(*(long *)(this + 0x138) + -0x10)) {
    CFGNode::branch_existing<vmips::j>(*(CFGNode **)(this + 0x148),&__return_storage_ptr__->first);
  }
  std::vector<std::shared_ptr<vmips::CFGNode>,_std::allocator<std::shared_ptr<vmips::CFGNode>_>_>::
  push_back((vector<std::shared_ptr<vmips::CFGNode>,_std::allocator<std::shared_ptr<vmips::CFGNode>_>_>
             *)(this + 0x130),&__return_storage_ptr__->first);
  std::vector<std::shared_ptr<vmips::CFGNode>,_std::allocator<std::shared_ptr<vmips::CFGNode>_>_>::
  push_back((vector<std::shared_ptr<vmips::CFGNode>,_std::allocator<std::shared_ptr<vmips::CFGNode>_>_>
             *)(this + 0x130),&__return_storage_ptr__->second);
  vmips::Function::switch_to(this);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_48);
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::shared_ptr<CFGNode>, std::shared_ptr<CFGNode>> branch(Args &&... args) {
            auto a = next_name();
            auto b = next_name();
            auto ret = cursor->template branch<Instr, Args...>(a, b, std::forward<Args>(args)...);
            if (cursor != blocks.back()) cursor->branch_existing<vmips::j>(ret.first);
            blocks.push_back(ret.first);
            blocks.push_back(ret.second);
            switch_to(ret.first);
            return ret;
        }